

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O3

int64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getSmallInt(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  byte *pbVar2;
  uint64_t uVar3;
  int64_t iVar4;
  ulong uVar5;
  Exception *pEVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  bVar1 = **(byte **)this;
  if ((byte)(bVar1 - 0x30) < 10) {
    return (ulong)(bVar1 & 0xf);
  }
  if ((byte)(bVar1 - 0x3a) < 6) {
    return (long)(char)bVar1 | 0xffffffffffffffc0;
  }
  if (((int)(char)bVar1 & 0xf0U | 8) != 0x28) {
    pEVar6 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar6,InvalidValueType,"Expecting type SmallInt");
    __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
  }
  pbVar2 = *(byte **)this;
  bVar1 = *pbVar2;
  uVar7 = bVar1 & 0xfffffff8;
  if (uVar7 == 0x28) {
    uVar3 = getUIntUnchecked(this);
    if (-1 < (long)uVar3) {
      return uVar3;
    }
    pEVar6 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar6,NumberOutOfRange);
LAB_0010d5b1:
    __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
  }
  if (uVar7 != 0x20) {
    if ((bVar1 & 0xf0) == 0x30) {
      iVar4 = getSmallIntUnchecked(this);
      return iVar4;
    }
    pEVar6 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar6,InvalidValueType,"Expecting type Int");
    goto LAB_0010d5b1;
  }
  switch(bVar1) {
  case 0x20:
    uVar5 = (ulong)pbVar2[1];
    break;
  case 0x21:
    uVar5 = (ulong)*(ushort *)(pbVar2 + 1);
    break;
  case 0x22:
    uVar8 = (ulong)pbVar2[1];
    uVar5 = (ulong)*(ushort *)(pbVar2 + 2) << 8;
    goto LAB_0010d550;
  case 0x23:
    uVar5 = (ulong)*(uint *)(pbVar2 + 1);
    break;
  case 0x24:
    uVar7 = *(uint *)(pbVar2 + 1);
    uVar5 = (ulong)pbVar2[5];
    goto LAB_0010d54c;
  case 0x25:
    uVar7 = *(uint *)(pbVar2 + 1);
    uVar5 = (ulong)*(ushort *)(pbVar2 + 5);
LAB_0010d54c:
    uVar8 = (ulong)uVar7;
    uVar5 = uVar5 << 0x20;
LAB_0010d550:
    uVar5 = uVar5 | uVar8;
    break;
  case 0x26:
    uVar5 = (ulong)*(uint7 *)(pbVar2 + 1);
    break;
  case 0x27:
    return *(int64_t *)(pbVar2 + 1);
  default:
    uVar5 = 0;
  }
  lVar9 = 0;
  if (*(long *)((anonymous_namespace)::maxValues + (ulong)(bVar1 - 0x20) * 8) <= (long)uVar5) {
    lVar9 = *(long *)((anonymous_namespace)::maxValues + (ulong)(bVar1 - 0x20) * 8) * 2;
  }
  return uVar5 - lVar9;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }